

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodeObjLit * __thiscall
Parser::CreateObjectPatternNode
          (Parser *this,ParseNodePtr pnodeMemberList,charcount_t ichMin,charcount_t ichLim,
          bool convertToPattern)

{
  ParseNodePtr pPVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  undefined4 *puVar5;
  ParseNodeBin *pPVar6;
  undefined7 uVar9;
  ParseNodePtr pPVar7;
  ParseNodeBin *extraout_RAX;
  undefined8 extraout_RAX_00;
  ParseNodeType *pPVar8;
  ParseNodePtr *ppPVar10;
  undefined3 in_register_00000081;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined4 uVar14;
  ParseNodePtr local_60;
  int local_54;
  charcount_t local_50;
  charcount_t local_4c;
  ParseNodePtr local_48;
  ParseNodePtr pnodeMemberNodeList;
  undefined4 local_38;
  uint local_34;
  
  iVar11 = CONCAT31(in_register_00000081,convertToPattern);
  uVar12 = 0;
  local_48 = (ParseNodePtr)0x0;
  if (iVar11 == 0) {
    local_48 = pnodeMemberList;
  }
  if (pnodeMemberList == (ParseNodePtr)0x0) {
    uVar14 = 0;
    uVar13 = 0;
  }
  else {
    OVar4 = pnodeMemberList->nop;
    local_50 = ichLim;
    local_4c = ichMin;
    if (((OVar4 != knopList && !convertToPattern) && (OVar4 != knopEllipsis)) &&
       (OVar4 != knopObjectPatternMember)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x4c4,
                         "(pnodeMemberList->nop == knopList || (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || convertToPattern || pnodeMemberList->nop == knopEllipsis)"
                         ,
                         "pnodeMemberList->nop == knopList || (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || convertToPattern || pnodeMemberList->nop == knopEllipsis"
                        );
      if (!bVar3) {
LAB_00e6a436:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    ppPVar10 = &local_60;
    local_38 = 0;
    local_60 = pnodeMemberList;
    pPVar6 = (ParseNodeBin *)__tls_get_addr(&PTR_01548f08);
    local_34 = 0;
    uVar12 = 0;
    local_54 = iVar11;
    pnodeMemberNodeList = (ParseNodePtr)pPVar6;
    do {
      OVar4 = pnodeMemberList->nop;
      uVar9 = (undefined7)((ulong)pPVar6 >> 8);
      if (OVar4 != knopList) {
        if ((char)iVar11 != '\0') {
          pnodeMemberList = ConvertMemberToMemberPattern(this,pnodeMemberList);
          AppendToList(this,&local_48,pnodeMemberList);
          OVar4 = pnodeMemberList->nop;
          uVar9 = (undefined7)((ulong)extraout_RAX_00 >> 8);
        }
        pPVar7 = pnodeMemberNodeList;
        if (OVar4 == knopEllipsis) {
          local_38 = (undefined4)CONCAT71(uVar9,1);
          ichLim = local_50;
          ichMin = local_4c;
          uVar14 = local_38;
          uVar13 = local_34;
        }
        else {
          pPVar6 = ParseNode::AsParseNodeBin(pnodeMemberList);
          uVar13 = local_34;
          pPVar1 = pPVar6->pnode1;
          OVar4 = pPVar1->nop;
          if ((OVar4 != knopStr) && (OVar4 != knopComputedName)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            pPVar7->nop = knopName;
            pPVar7->field_0x1 = 0;
            pPVar7->grfpn = 0;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x4ce,
                               "(nameNode->nop == knopComputedName || nameNode->nop == knopStr)",
                               "nameNode->nop == knopComputedName || nameNode->nop == knopStr");
            if (!bVar3) goto LAB_00e6a436;
            pPVar7->nop = knopNone;
            pPVar7->field_0x1 = 0;
            pPVar7->grfpn = 0;
            OVar4 = pPVar1->nop;
          }
          ichLim = local_50;
          ichMin = local_4c;
          uVar14 = local_38;
          if (OVar4 == knopComputedName) {
            uVar12 = uVar12 + 1;
            uVar13 = local_34;
          }
          else {
            local_34 = uVar13 + 1;
            uVar13 = local_34;
          }
        }
        break;
      }
      pPVar6 = ParseNode::AsParseNodeBin(pnodeMemberList);
      pPVar7 = pPVar6->pnode1;
      if ((char)iVar11 != '\0') {
        pPVar7 = ConvertMemberToMemberPattern(this,pPVar7);
        AppendToList(this,&local_48,pPVar7);
        pPVar6 = extraout_RAX;
      }
      if (pPVar7->nop == knopEllipsis) {
        local_38 = (int)CONCAT71((int7)((ulong)pPVar6 >> 8),1);
      }
      else {
        pPVar6 = ParseNode::AsParseNodeBin(pPVar7);
        pPVar7 = pPVar6->pnode1;
        OVar4 = pPVar7->nop;
        if ((OVar4 != knopStr) && (OVar4 != knopComputedName)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pPVar1 = pnodeMemberNodeList;
          pPVar1->nop = knopName;
          pPVar1->field_0x1 = 0;
          pPVar1->grfpn = 0;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0x4ce,
                             "(nameNode->nop == knopComputedName || nameNode->nop == knopStr)",
                             "nameNode->nop == knopComputedName || nameNode->nop == knopStr");
          if (!bVar3) goto LAB_00e6a436;
          pPVar1->nop = knopNone;
          pPVar1->field_0x1 = 0;
          pPVar1->grfpn = 0;
          OVar4 = pPVar7->nop;
          iVar11 = local_54;
        }
        if (OVar4 == knopComputedName) {
          uVar12 = uVar12 + 1;
        }
        else {
          local_34 = local_34 + 1;
        }
      }
      pPVar6 = ParseNode::AsParseNodeBin(*ppPVar10);
      pnodeMemberList = pPVar6->pnode2;
      ppPVar10 = &pPVar6->pnode2;
      ichLim = local_50;
      ichMin = local_4c;
      uVar14 = local_38;
      uVar13 = local_34;
    } while (pnodeMemberList != (ParseNodePtr)0x0);
  }
  pPVar7 = local_48;
  pPVar8 = CreateNodeForOpT<(OpCode)112>(this,ichMin,ichLim);
  (pPVar8->super_ParseNodeUni).pnode1 = pPVar7;
  pPVar8->computedCount = uVar12;
  pPVar8->staticCount = uVar13;
  pPVar8->hasRest = SUB41(uVar14,0);
  return pPVar8;
}

Assistant:

ParseNodeObjLit * Parser::CreateObjectPatternNode(ParseNodePtr pnodeMemberList, charcount_t ichMin, charcount_t ichLim, bool convertToPattern) {
    // Count the number of non-rest members in the object
    uint32 staticCount = 0;
    uint32 computedCount = 0;
    bool hasRest = false;
    ParseNodePtr pnodeMemberNodeList = convertToPattern ? nullptr : pnodeMemberList;
    if (pnodeMemberList != nullptr)
    {
        Assert(pnodeMemberList->nop == knopList || 
              (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || 
              convertToPattern ||
              pnodeMemberList->nop == knopEllipsis);
        ForEachItemInList(pnodeMemberList, [&](ParseNodePtr item) {
            ParseNodePtr memberNode = convertToPattern ? ConvertMemberToMemberPattern(item) : item;
            if (convertToPattern)
            {
                AppendToList(&pnodeMemberNodeList, memberNode);
            }
            if (memberNode->nop != knopEllipsis)
            {
                ParseNodePtr nameNode = memberNode->AsParseNodeBin()->pnode1;
                Assert(nameNode->nop == knopComputedName || nameNode->nop == knopStr);
                if (nameNode->nop == knopComputedName)
                {
                    computedCount++;
                }
                else
                {
                    staticCount++;
                }
            }
            else
            {
                hasRest = true;
            }
        });
    }

    ParseNodeObjLit * objectPatternNode = CreateNodeForOpT<knopObjectPattern>(ichMin, ichLim);
    objectPatternNode->pnode1 = pnodeMemberNodeList;
    objectPatternNode->computedCount = computedCount;
    objectPatternNode->staticCount = staticCount;
    objectPatternNode->hasRest = hasRest;
    return objectPatternNode;
}